

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O1

void __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::SetData
          (TPZQuadSphere<pzgeom::TPZGeoQuad> *this,REAL *R,TPZVec<double> *xc)

{
  this->fR = *R;
  TPZVec<double>::operator=(&this->fxc,xc);
  return;
}

Assistant:

void SetData(const REAL &R, const TPZVec<REAL> &xc)
		{
			fR = R;
			fxc = xc;
#ifdef PZDEBUG
			if (R <= 0) {
				PZError << "R must be positive!\n";
				DebugStop();
			}
			if (xc.NElements() != 3) {
				PZError << "XCenter must have 3 coordinates!\n";
				DebugStop();
			}
#endif
		}